

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroupCollection::InitializeParallelScan
          (RowGroupCollection *this,ParallelCollectionScanState *state)

{
  RowGroupSegmentTree *this_00;
  RowGroup *pRVar1;
  
  state->collection = this;
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  pRVar1 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                     (&this_00->super_SegmentTree<duckdb::RowGroup,_true>);
  state->current_row_group = pRVar1;
  state->vector_index = 0;
  state->max_row = (this->total_rows).super___atomic_base<unsigned_long>._M_i + this->row_start;
  state->batch_index = 0;
  LOCK();
  (state->processed_rows).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  return;
}

Assistant:

void RowGroupCollection::InitializeParallelScan(ParallelCollectionScanState &state) {
	state.collection = this;
	state.current_row_group = row_groups->GetRootSegment();
	state.vector_index = 0;
	state.max_row = row_start + total_rows;
	state.batch_index = 0;
	state.processed_rows = 0;
}